

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxu.c
# Opt level: O0

void Fxu_MatrixRingVarsUnmark(Fxu_Matrix *p)

{
  Fxu_Var *local_30;
  Fxu_Var *local_28;
  Fxu_Var *local_20;
  Fxu_Var *pVar2;
  Fxu_Var *pVar;
  Fxu_Matrix *p_local;
  
  if (p->pOrderVars != (Fxu_Var *)0x0) {
    pVar2 = p->pOrderVars;
    if (pVar2 == (Fxu_Var *)0x1) {
      local_28 = (Fxu_Var *)0x1;
    }
    else {
      local_28 = pVar2->pOrder;
    }
    local_20 = local_28;
    while (pVar2 != (Fxu_Var *)0x1) {
      pVar2->pOrder = (Fxu_Var *)0x0;
      pVar2 = local_20;
      if (local_20 == (Fxu_Var *)0x1) {
        local_30 = (Fxu_Var *)0x1;
      }
      else {
        local_30 = local_20->pOrder;
      }
      local_20 = local_30;
    }
  }
  p->pOrderVars = (Fxu_Var *)0x0;
  p->ppTailVars = (Fxu_Var **)0x0;
  return;
}

Assistant:

void Fxu_MatrixRingVarsUnmark( Fxu_Matrix * p )
{
    Fxu_Var * pVar, * pVar2;
    // unmark the vars
    Fxu_MatrixForEachVarInRingSafe( p, pVar, pVar2 )
        pVar->pOrder = NULL;
    Fxu_MatrixRingVarsReset( p );
}